

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

uint __thiscall CodeGenGenericContext::MemFind(CodeGenGenericContext *this,x86Argument *address)

{
  MemCache *pMVar1;
  MemCache *entry;
  uint i;
  x86Argument *address_local;
  CodeGenGenericContext *this_local;
  
  entry._4_4_ = 0;
  while( true ) {
    if (0xf < entry._4_4_) {
      return 0;
    }
    pMVar1 = this->memCache + entry._4_4_;
    if (((((pMVar1->value).type != argNone) && ((pMVar1->address).type != argNone)) &&
        ((pMVar1->address).field_1.reg == (address->field_1).reg)) &&
       ((((pMVar1->address).ptrNum == address->ptrNum &&
         ((pMVar1->address).ptrBase == address->ptrBase)) &&
        ((pMVar1->address).ptrIndex == address->ptrIndex)))) break;
    entry._4_4_ = entry._4_4_ + 1;
  }
  return entry._4_4_ + 1;
}

Assistant:

unsigned CodeGenGenericContext::MemFind(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.value.type != x86Argument::argNone && entry.address.type != x86Argument::argNone && entry.address.ptrSize == address.ptrSize && entry.address.ptrNum == address.ptrNum && entry.address.ptrBase == address.ptrBase && entry.address.ptrIndex == address.ptrIndex)
			return i + 1;
	}

	return 0;
}